

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O3

QVariant * __thiscall
QSqlQueryModel::headerData
          (QVariant *__return_storage_ptr__,QSqlQueryModel *this,int section,Orientation orientation
          ,int role)

{
  QSqlQueryModelPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  int local_8c;
  undefined1 local_88 [16];
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._12_4_ = role;
  if (orientation != Horizontal) {
LAB_0012c854:
    QAbstractItemModel::headerData((int)__return_storage_ptr__,(Orientation)this,section);
    goto LAB_0012c861;
  }
  this_00 = *(QSqlQueryModelPrivate **)&this->field_0x8;
  local_58._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QList<QHash<int,_QVariant>_>::value
            ((QList<QHash<int,_QVariant>_> *)&local_78,(qsizetype)&this_00->headers);
  QHash<int,_QVariant>::value
            ((QVariant *)&local_58,(QHash<int,_QVariant> *)&local_78,(int *)(local_88 + 0xc));
  QHash<int,_QVariant>::~QHash((QHash<int,_QVariant> *)&local_78);
  if (local_88._12_4_ == 0) {
    if (uStack_40 < 4) {
      QList<QHash<int,_QVariant>_>::value
                ((QList<QHash<int,_QVariant>_> *)local_88,(qsizetype)&this_00->headers);
      local_8c = 2;
      QHash<int,_QVariant>::value(&local_78,(QHash<int,_QVariant> *)local_88,&local_8c);
      QVariant::operator=((QVariant *)&local_58,&local_78);
      QVariant::~QVariant(&local_78);
      QHash<int,_QVariant>::~QHash((QHash<int,_QVariant> *)local_88);
      goto LAB_0012c776;
    }
LAB_0012c77e:
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
    *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uStack_40;
    (__return_storage_ptr__->d).data.shared = local_58.shared;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    uStack_40 = 2;
  }
  else {
LAB_0012c776:
    if (3 < uStack_40) goto LAB_0012c77e;
    if (local_88._12_4_ != 0) {
LAB_0012c83b:
      QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_0012c854;
    }
    iVar1 = QSqlRecord::count(&this_00->rec);
    if (iVar1 <= section) goto LAB_0012c83b;
    iVar1 = QSqlQueryModelPrivate::columnInQuery(this_00,section);
    if (iVar1 == -1) goto LAB_0012c83b;
    QSqlRecord::fieldName((QString *)&local_78,&this_00->rec,section);
    QVariant::QVariant(__return_storage_ptr__,(QString *)&local_78);
    if ((QArrayData *)local_78.d.data.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.d.data.shared = *(int *)local_78.d.data.shared + -1;
      UNLOCK();
      if (*(int *)local_78.d.data.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.d.data.shared,2,0x10);
      }
    }
  }
  QVariant::~QVariant((QVariant *)&local_58);
LAB_0012c861:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlQueryModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QSqlQueryModel);
    if (orientation == Qt::Horizontal) {
        QVariant val = d->headers.value(section).value(role);
        if (role == Qt::DisplayRole && !val.isValid())
            val = d->headers.value(section).value(Qt::EditRole);
        if (val.isValid())
            return val;
        if (role == Qt::DisplayRole && d->rec.count() > section && d->columnInQuery(section) != -1)
            return d->rec.fieldName(section);
    }
    return QAbstractItemModel::headerData(section, orientation, role);
}